

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_flush(lua_State *L)

{
  int32_t idx;
  int traceno;
  lua_State *L_local;
  
  if ((L->base < L->top) && ((uint)((int)(L->base->field_4).it >> 0xf) < 0xfffffff3)) {
    idx = lj_lib_checkint(L,1);
    luaJIT_setmode(L,idx,0x205);
    L_local._4_4_ = 0;
  }
  else {
    L_local._4_4_ = setjitmode(L,0x200);
  }
  return L_local._4_4_;
}

Assistant:

LJLIB_CF(jit_flush)
{
#if LJ_HASJIT
  if (L->base < L->top && tvisnumber(L->base)) {
    int traceno = lj_lib_checkint(L, 1);
    luaJIT_setmode(L, traceno, LUAJIT_MODE_FLUSH|LUAJIT_MODE_TRACE);
    return 0;
  }
#endif
  return setjitmode(L, LUAJIT_MODE_FLUSH);
}